

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

unsigned_long __thiscall
el::base::TypedConfigurations::unsafeGetConfigByVal<unsigned_long>
          (TypedConfigurations *this,Level level,
          map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
          *confMap,char *confName)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  mapped_type_conflict *pmVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  key_type local_4;
  
  p_Var4 = (confMap->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var4 != (_Base_ptr)0x0) {
    p_Var1 = &(confMap->_M_t)._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var1->_M_header;
    do {
      bVar5 = p_Var4[1]._M_color < level;
      if (!bVar5) {
        p_Var2 = p_Var4;
      }
      p_Var4 = (&p_Var4->_M_left)[bVar5];
    } while (p_Var4 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var2[1]._M_color <= level)) {
      return (unsigned_long)p_Var2[1]._M_parent;
    }
  }
  pmVar3 = utils::std::
           map<el::Level,_unsigned_long,_std::less<el::Level>,_std::allocator<std::pair<const_el::Level,_unsigned_long>_>_>
           ::at(confMap,&local_4);
  return *pmVar3;
}

Assistant:

Conf_T unsafeGetConfigByVal(Level level, const std::map<Level, Conf_T>* confMap, const char* confName) {
    ELPP_UNUSED(confName);
    typename std::map<Level, Conf_T>::const_iterator it = confMap->find(level);
    if (it == confMap->end()) {
      try {
        return confMap->at(Level::Global);
      } catch (...) {
        ELPP_INTERNAL_ERROR("Unable to get configuration [" << confName << "] for level ["
                            << LevelHelper::convertToString(level) << "]"
                            << std::endl << "Please ensure you have properly configured logger.", false);
        return Conf_T();
      }
    }
    return it->second;
  }